

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O0

void __thiscall
Catch::RunContext::handleExpr
          (RunContext *this,AssertionInfo *info,ITransientExpression *expr,
          AssertionReaction *reaction)

{
  byte bVar1;
  bool bVar2;
  pointer pIVar3;
  RunContext *in_RCX;
  ITransientExpression *in_RDX;
  long in_RSI;
  long *in_RDI;
  undefined1 uVar4;
  bool result;
  bool negated;
  bool in_stack_000000f7;
  ITransientExpression *in_stack_000000f8;
  OfType in_stack_00000104;
  AssertionInfo *in_stack_00000108;
  RunContext *in_stack_00000110;
  undefined6 in_stack_ffffffffffffffd8;
  
  pIVar3 = clara::std::
           unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>::
           operator->((unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
                       *)0x12c60e);
  (*pIVar3->_vptr_IStreamingReporter[9])(pIVar3,in_RSI);
  bVar1 = isFalseTest(*(int *)(in_RSI + 0x30));
  bVar2 = ITransientExpression::getResult(in_RDX);
  uVar4 = bVar2 != (bool)(bVar1 & 1);
  if ((bool)uVar4) {
    if ((*(byte *)((long)in_RDI + 0x1eb) & 1) == 0) {
      (**(code **)(*in_RDI + 0x88))();
    }
    else {
      reportExpr(in_stack_00000110,in_stack_00000108,in_stack_00000104,in_stack_000000f8,
                 in_stack_000000f7);
    }
  }
  else {
    reportExpr(in_stack_00000110,in_stack_00000108,in_stack_00000104,in_stack_000000f8,
               in_stack_000000f7);
    populateReaction(in_RCX,(AssertionReaction *)
                            CONCAT17(bVar1,CONCAT16(uVar4,in_stack_ffffffffffffffd8)));
  }
  return;
}

Assistant:

void RunContext::handleExpr(
        AssertionInfo const& info,
        ITransientExpression const& expr,
        AssertionReaction& reaction
    ) {
        m_reporter->assertionStarting( info );

        bool negated = isFalseTest( info.resultDisposition );
        bool result = expr.getResult() != negated;

        if( result ) {
            if (!m_includeSuccessfulResults) {
                assertionPassed();
            }
            else {
                reportExpr(info, ResultWas::Ok, &expr, negated);
            }
        }
        else {
            reportExpr(info, ResultWas::ExpressionFailed, &expr, negated );
            populateReaction( reaction );
        }
    }